

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::Version::SharedDtor(Version *this)

{
  internal::ArenaStringPtr::DestroyNoArena
            (&this->suffix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  return;
}

Assistant:

void Version::SharedDtor() {
  suffix_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}